

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O0

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       *this,BinaryReader<mp::internal::EndiannessConverter> *bound_reader)

{
  StringRef name_00;
  NumericExpr expr_00;
  LogicalExpr expr_01;
  NumericExpr expr_02;
  NumericExpr expr_03;
  CStringRef arg0;
  CStringRef arg0_00;
  CStringRef arg0_01;
  CStringRef arg0_02;
  CStringRef arg0_03;
  bool bVar1;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *this_00;
  long in_RSI;
  undefined8 *in_RDI;
  int info;
  StringRef name;
  int num_args;
  int type;
  int index_3;
  LinearExprHandler expr_handler;
  int position;
  int num_linear_terms;
  int expr_index;
  NumericExpr expr;
  int obj_type;
  int index_2;
  int index_1;
  int index;
  char c;
  bool read_bounds;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_fffffffffffffeb8;
  NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *in_stack_fffffffffffffec0;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffec8;
  BinaryReader<mp::internal::EndiannessConverter> *in_stack_fffffffffffffed0;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffed8;
  uint lb;
  LinearExprBuilder in_stack_fffffffffffffee0;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  *in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff1c;
  BasicCStringRef<char> in_stack_ffffffffffffff30;
  BasicCStringRef<char> local_c8;
  BasicCStringRef<char> local_c0;
  BasicCStringRef<char> local_b8;
  uint local_ac;
  char *local_a8;
  size_t local_a0;
  StringRef local_98;
  int local_84;
  BasicCStringRef<char> local_80;
  int local_78;
  int local_74;
  ExprBase local_70;
  LinearExpr *local_68;
  LinearExpr *local_60;
  int local_54;
  int local_50;
  int local_4c;
  Impl *local_48;
  ExprBase local_40;
  int local_38;
  int local_34;
  ExprBase local_30;
  int local_24;
  ExprBase local_20;
  int local_18;
  char local_12;
  byte local_11;
  long local_10;
  
  local_11 = in_RSI == 0;
  *(int *)((long)in_RDI + 0x1c) =
       *(int *)in_RDI[1] + *(int *)(in_RDI[1] + 0x90) + *(int *)(in_RDI[1] + 0x94) +
       *(int *)(in_RDI[1] + 0x98) + *(int *)(in_RDI[1] + 0x9c) + *(int *)(in_RDI[1] + 0xa0);
  local_10 = in_RSI;
  do {
    local_12 = ReaderBase::ReadChar((ReaderBase *)*in_RDI);
    this_00 = (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
               *)(ulong)(uint)(int)local_12;
    lb = (uint)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    switch(this_00) {
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x0:
      bVar1 = ReaderBase::IsEOF((ReaderBase *)0x2aeb1b);
      if (bVar1) {
        if ((local_11 & 1) != 0) {
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_c8,"segment \'b\' missing");
          arg0_02.data_._4_4_ = in_stack_fffffffffffffef4;
          arg0_02.data_._0_4_ = in_stack_fffffffffffffef0;
          BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffee8,arg0_02);
        }
        return;
      }
    default:
      in_stack_fffffffffffffeb8 =
           (NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)*in_RDI;
      fmt::BasicCStringRef<char>::BasicCStringRef
                ((BasicCStringRef<char> *)&stack0xffffffffffffff30,"invalid segment type");
      arg0_03.data_._4_4_ = in_stack_fffffffffffffef4;
      arg0_03.data_._0_4_ = in_stack_fffffffffffffef0;
      BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffee8,arg0_03);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x43:
      local_18 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)in_stack_fffffffffffffee0.expr_,lb);
      BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
      in_stack_ffffffffffffff10 =
           (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            *)in_RDI[2];
      in_stack_ffffffffffffff1c = local_18;
      local_20.impl_ =
           (Impl *)ReadNumericExpr(in_stack_fffffffffffffec8,
                                   SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0));
      expr_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffef4;
      expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef0;
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnAlgebraicCon
                ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                 in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0.expr_ >> 0x20),
                 expr_00);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x46:
      local_74 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)in_stack_fffffffffffffee0.expr_,lb);
      local_78 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                           (in_stack_fffffffffffffed0);
      if ((local_78 != 0) && (local_78 != 1)) {
        in_stack_fffffffffffffee0.expr_ = (LinearExpr *)*in_RDI;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_80,"invalid function type");
        arg0.data_._4_4_ = in_stack_fffffffffffffef4;
        arg0.data_._0_4_ = in_stack_fffffffffffffef0;
        BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffee8,arg0);
      }
      local_84 = BinaryReader<mp::internal::EndiannessConverter>::ReadInt<int>
                           ((BinaryReader<mp::internal::EndiannessConverter> *)
                            in_stack_fffffffffffffec0);
      local_98 = BinaryReader<mp::internal::EndiannessConverter>::ReadName
                           ((BinaryReader<mp::internal::EndiannessConverter> *)0x2ae8bc);
      BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
      local_a8 = local_98.data_;
      local_a0 = local_98.size_;
      name_00.size_._0_4_ = in_stack_fffffffffffffef0;
      name_00.data_ = (char *)in_stack_fffffffffffffee8;
      name_00.size_._4_4_ = in_stack_fffffffffffffef4;
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnFunction
                ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                 in_stack_fffffffffffffee0.expr_,(int)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                 name_00,(int)in_stack_fffffffffffffed8,
                 (Type)((ulong)in_stack_fffffffffffffed0 >> 0x20));
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x47:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)in_stack_fffffffffffffee0.expr_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x4a:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)in_stack_fffffffffffffee0.expr_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x4b:
      ReadColumnSizes<false>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)in_stack_fffffffffffffee0.expr_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x4c:
      local_24 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)in_stack_fffffffffffffee0.expr_,lb);
      BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
      local_30.impl_ = (Impl *)ReadLogicalExpr(in_stack_fffffffffffffee8);
      expr_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffef4;
      expr_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef0;
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnLogicalCon
                ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                 in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0.expr_ >> 0x20),
                 expr_01);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x4f:
      local_34 = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)in_stack_fffffffffffffee0.expr_,lb);
      local_38 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                           (in_stack_fffffffffffffed0);
      BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
      local_40.impl_ =
           (Impl *)ReadNumericExpr(in_stack_fffffffffffffec8,
                                   SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0));
      bVar1 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::NeedObj
                        (in_stack_fffffffffffffec0,(int)((ulong)in_stack_fffffffffffffeb8 >> 0x20));
      if (bVar1) {
        NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::resulting_obj_index
                  (in_stack_fffffffffffffeb8,0);
        local_48 = local_40.impl_;
        expr_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffef4;
        expr_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef0;
        NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnObj
                  ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                   in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0.expr_ >> 0x20),
                   (Type)in_stack_fffffffffffffee0.expr_,expr_02);
      }
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x53:
      local_ac = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                           (in_stack_fffffffffffffed0);
      if (7 < (int)local_ac) {
        in_stack_fffffffffffffed8 =
             (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
              *)*in_RDI;
        fmt::BasicCStringRef<char>::BasicCStringRef(&local_b8,"invalid suffix kind");
        arg0_00.data_._4_4_ = in_stack_fffffffffffffef4;
        arg0_00.data_._0_4_ = in_stack_fffffffffffffef0;
        BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffee8,arg0_00);
      }
      in_stack_fffffffffffffed0 =
           (BinaryReader<mp::internal::EndiannessConverter> *)(ulong)(local_ac & 3);
      switch(in_stack_fffffffffffffed0) {
      case (BinaryReader<mp::internal::EndiannessConverter> *)0x0:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  (this_00,in_stack_ffffffffffffff1c);
        break;
      case (BinaryReader<mp::internal::EndiannessConverter> *)0x1:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ConHandler>
                  (this_00,in_stack_ffffffffffffff1c);
        break;
      case (BinaryReader<mp::internal::EndiannessConverter> *)0x2:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ObjHandler>
                  (this_00,in_stack_ffffffffffffff1c);
        break;
      case (BinaryReader<mp::internal::EndiannessConverter> *)0x3:
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadSuffix<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::ProblemHandler>
                  (this_00,in_stack_ffffffffffffff1c);
      }
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x56:
      local_4c = ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                           *)in_stack_fffffffffffffee0.expr_,lb,(uint)in_stack_fffffffffffffed8);
      local_4c = local_4c - *(int *)in_RDI[1];
      local_50 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                           (in_stack_fffffffffffffed0);
      local_54 = BinaryReader<mp::internal::EndiannessConverter>::ReadUInt
                           (in_stack_fffffffffffffed0);
      BinaryReaderBase::ReadTillEndOfLine((BinaryReaderBase *)*in_RDI);
      local_60 = (LinearExpr *)
                 NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::BeginCommonExpr
                           ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                            in_stack_fffffffffffffed8,
                            (int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                            (int)in_stack_fffffffffffffed0);
      if (local_50 != 0) {
        local_68 = local_60;
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::ReadLinearExpr<mp::BasicProblem<mp::BasicProblemParams<int>>::LinearExprBuilder>
                  (in_stack_fffffffffffffed8,(int)((ulong)in_stack_fffffffffffffed0 >> 0x20),
                   in_stack_fffffffffffffee0);
      }
      in_stack_fffffffffffffee8 =
           (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
            *)in_RDI[2];
      in_stack_fffffffffffffef4 = local_4c;
      local_70.impl_ =
           (Impl *)ReadNumericExpr(in_stack_fffffffffffffec8,
                                   SUB81((ulong)in_stack_fffffffffffffec0 >> 0x38,0));
      expr_03.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffef4;
      expr_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffef0;
      NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::EndCommonExpr
                ((NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_> *)
                 in_stack_fffffffffffffee8,(int)((ulong)in_stack_fffffffffffffee0.expr_ >> 0x20),
                 expr_03,(int)in_stack_fffffffffffffee0.expr_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x62:
      if ((local_11 & 1) == 0) {
        if (local_10 == 0) {
          in_stack_fffffffffffffec8 =
               (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                *)*in_RDI;
          fmt::BasicCStringRef<char>::BasicCStringRef(&local_c0,"duplicate \'b\' segment");
          arg0_01.data_._4_4_ = in_stack_fffffffffffffef4;
          arg0_01.data_._0_4_ = in_stack_fffffffffffffef0;
          BinaryReaderBase::ReportError<>((BinaryReaderBase *)in_stack_fffffffffffffee8,arg0_01);
        }
        BinaryReader<mp::internal::EndiannessConverter>::operator=
                  ((BinaryReader<mp::internal::EndiannessConverter> *)in_stack_fffffffffffffec0,
                   (BinaryReader<mp::internal::EndiannessConverter> *)in_stack_fffffffffffffeb8);
        local_10 = 0;
      }
      else {
        NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
        ::
        ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                  (in_stack_ffffffffffffff10);
        ReaderBase::ptr((ReaderBase *)*in_RDI);
        if ((*(uint *)(in_RDI + 3) & 1) != 0) {
          return;
        }
        local_11 = 0;
      }
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x64:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x6b:
      ReadColumnSizes<true>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x72:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadBounds<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::AlgebraicConHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)in_stack_ffffffffffffff30.data_);
      break;
    case (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
          *)0x78:
      NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>
      ::
      ReadInitialValues<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>::VarHandler>
                ((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    }
  } while( true );
}

Assistant:

void NLReader<Reader, Handler>::Read(Reader *bound_reader) {
  bool read_bounds = bound_reader == 0;
  // TextReader::ReadHeader checks that this doesn't overflow.
  num_vars_and_exprs_ = header_.num_vars +
      header_.num_common_exprs_in_both +
      header_.num_common_exprs_in_cons +
      header_.num_common_exprs_in_objs +
      header_.num_common_exprs_in_single_cons +
      header_.num_common_exprs_in_single_objs;
  for (;;) {
    char c = reader_.ReadChar();
    switch (c) {
    case 'C': {
      // Nonlinear part of an algebraic constraint body.
      int index = ReadUInt(header_.num_algebraic_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnAlgebraicCon(index, ReadNumericExpr(true));
      break;
    }
    case 'L': {
      // Logical constraint expression.
      int index = ReadUInt(header_.num_logical_cons);
      reader_.ReadTillEndOfLine();
      handler_.OnLogicalCon(index, ReadLogicalExpr());
      break;
    }
    case 'O': {
      // Objective type and nonlinear part of an objective expression.
      int index = ReadUInt(header_.num_objs);
      int obj_type = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      NumericExpr expr = ReadNumericExpr(true);
      if (handler_.NeedObj(index))
        handler_.OnObj(handler_.resulting_obj_index(index),
                       obj_type != 0 ? obj::MAX : obj::MIN,
                       expr);
      break;
    }
    case 'V': {
      // Defined variable definition (must precede V, C, L, O segments
      // where used).
      int expr_index = ReadUInt(header_.num_vars, num_vars_and_exprs_);
      expr_index -= header_.num_vars;
      int num_linear_terms = reader_.ReadUInt();
      int position = reader_.ReadUInt();
      reader_.ReadTillEndOfLine();
      typename Handler::LinearExprHandler
          expr_handler(handler_.BeginCommonExpr(expr_index, num_linear_terms));
      if (num_linear_terms != 0)
        ReadLinearExpr(num_linear_terms, expr_handler);
      handler_.EndCommonExpr(expr_index, ReadNumericExpr(), position);
      break;
    }
    case 'F': {
      // Imported function description.
      int index = ReadUInt(header_.num_funcs);
      int type = reader_.ReadUInt();
      if (type != func::NUMERIC && type != func::SYMBOLIC)
        reader_.ReportError("invalid function type");
      int num_args = reader_.template ReadInt<int>();
      fmt::StringRef name = reader_.ReadName();
      reader_.ReadTillEndOfLine();
      handler_.OnFunction(index, name, num_args, static_cast<func::Type>(type));
      break;
    }
    case 'G':
      // Linear part of an objective expression & gradient sparsity.
      ReadLinearExpr<ObjHandler>();
      break;
    case 'J':
      // Jacobian sparsity & linear terms in constraints.
      ReadLinearExpr<AlgebraicConHandler>();
      break;
    case 'S': {
      // Suffix values.
      int info = reader_.ReadUInt();
      if (info > (internal::SUFFIX_KIND_MASK | suf::FLOAT))
        reader_.ReportError("invalid suffix kind");
      switch (info & internal::SUFFIX_KIND_MASK) {
      case suf::VAR:
        ReadSuffix<VarHandler>(info);
        break;
      case suf::CON:
        ReadSuffix<ConHandler>(info);
        break;
      case suf::OBJ:
        ReadSuffix<ObjHandler>(info);
        break;
      case suf::PROBLEM:
        ReadSuffix<ProblemHandler>(info);
        break;
      }
      break;
    }
    case 'b':
      // Bounds on variables.
      if (read_bounds) {
        ReadBounds<VarHandler>();
        reader_.ptr();
        if ((flags_ & READ_BOUNDS_FIRST) != 0)
          return;
        read_bounds = false;
        break;
      }
      if (!bound_reader)
        reader_.ReportError("duplicate 'b' segment");
      reader_ = *bound_reader;
      bound_reader = 0;
      break;
    case 'r':
      // Bounds on algebraic constraint bodies ("ranges").
      ReadBounds<AlgebraicConHandler>();
      break;
    case 'K':
      // Jacobian sparsity & linear constraint term matrix column sizes
      // (must precede all J segments).
      ReadColumnSizes<false>();
      break;
    case 'k':
      // Jacobian sparsity & linear constraint term matrix cumulative column
      // sizes (must precede all J segments).
      ReadColumnSizes<true>();
      break;
    case 'x':
      // Primal initial guess.
      ReadInitialValues<VarHandler>();
      break;
    case 'd':
      // Dual initial guess.
      ReadInitialValues<AlgebraicConHandler>();
      break;
    case '\0':
      if (reader_.IsEOF()) {
        if (read_bounds)
          reader_.ReportError("segment 'b' missing");
        return;
      }
      // Fall through.
    default:
      reader_.ReportError("invalid segment type");
    }
  }
}